

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O1

void __thiscall
cppcms::forwarder::add_forwarding_rule
          (forwarder *this,shared_ptr<cppcms::mount_point> *p,string *ip,int port)

{
  pointer pcVar1;
  mapped_type *this_00;
  unique_lock<booster::shared_mutex> lock;
  unique_lock<booster::shared_mutex> local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  int local_30;
  
  local_60._M_device = &this->mutex_;
  local_60._M_owns = false;
  std::unique_lock<booster::shared_mutex>::lock(&local_60);
  local_60._M_owns = true;
  pcVar1 = (ip->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar1,pcVar1 + ip->_M_string_length)
  ;
  local_30 = port;
  this_00 = std::
            map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            ::operator[](&this->rules_,p);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
  this_00->second = local_30;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::unique_lock<booster::shared_mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

void forwarder::add_forwarding_rule(booster::shared_ptr<mount_point> p,std::string const &ip,int port)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		rules_[p]=address_type(ip,port);
	}